

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

void __thiscall
Assimp::IRRImporter::GenerateGraph
          (IRRImporter *this,Node *root,aiNode *rootOut,aiScene *scene,BatchLoader *batch,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials,uint *defMatIdx)

{
  uint *puVar1;
  float fVar2;
  aiMaterial *paVar3;
  undefined1 auVar4 [16];
  aiString *paVar5;
  aiScene *paVar6;
  int iVar7;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar8;
  bool bVar9;
  uint uVar10;
  size_type sVar11;
  long lVar12;
  Logger *pLVar13;
  reference ppaVar14;
  reference ppaVar15;
  reference __x;
  ulong uVar16;
  aiCamera **ppaVar17;
  aiLight **ppaVar18;
  aiNode *this_00;
  reference ppNVar19;
  aiVector3t<float> aVar20;
  aiNode *node;
  uint i_3;
  aiMatrix4x4 *mat;
  float local_170;
  aiMatrix4x4 *local_168;
  float local_160;
  uint local_15c;
  undefined1 local_158 [4];
  uint a_2;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_138;
  aiMaterial **local_120;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  local_118;
  const_iterator local_110;
  uint local_108;
  uint i_2;
  aiMesh *local_f8;
  aiVector3t<float> local_ec;
  aiMesh *local_e0;
  uint local_d4;
  int local_d0;
  uint mul;
  int idx;
  uint a_1;
  uint a;
  bool bdo;
  aiMaterial *mat_1;
  pair<aiMaterial_*,_unsigned_int> *src_1;
  aiMesh *mesh;
  reference pvStack_a0;
  uint i_1;
  pair<aiMaterial_*,_unsigned_int> *src;
  undefined1 local_90 [4];
  uint i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  aiScene *local_50;
  aiScene *localScene;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvStack_40;
  uint oldMeshSize;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes_local;
  BatchLoader *batch_local;
  aiScene *scene_local;
  aiNode *rootOut_local;
  Node *root_local;
  IRRImporter *this_local;
  
  pvStack_40 = meshes;
  meshes_local = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)batch;
  batch_local = (BatchLoader *)scene;
  scene_local = (aiScene *)rootOut;
  rootOut_local = (aiNode *)root;
  root_local = (Node *)this;
  sVar11 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(meshes);
  pvVar8 = pvStack_40;
  localScene._4_4_ = (int)sVar11;
  switch((rootOut_local->mName).length) {
  case 0:
  case 5:
    break;
  case 1:
    local_f8 = StandardShapes::MakeMesh(StandardShapes::MakeHexahedron);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(pvVar8,&local_f8);
    aiVector3t<float>::operator*=
              ((aiVector3t<float> *)((rootOut_local->mName).data + 0x18),
               *(float *)((rootOut_local->mName).data + 0xac));
    paVar5 = &rootOut_local->mName;
    ppaVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back(pvStack_40);
    CopyMaterial(this,materials,
                 (vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  *)(paVar5->data + 0x94),defMatIdx,*ppaVar14);
    ppaVar15 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::back(materials);
    paVar3 = *ppaVar15;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&stack0xfffffffffffffefc,0.0,0.0,-1.0);
    SetupMapping(paVar3,aiTextureMapping_BOX,(aiVector3D *)&stack0xfffffffffffffefc);
    break;
  case 2:
  case 8:
    lVar12 = std::__cxx11::string::length();
    if (lVar12 != 0) {
      local_50 = BatchLoader::GetImport
                           ((BatchLoader *)meshes_local,
                            *(uint *)((rootOut_local->mName).data + 0x8c));
      if (local_50 == (aiScene *)0x0) {
        pLVar13 = DefaultLogger::get();
        std::operator+(&local_70,"IRR: Unable to load external file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((rootOut_local->mName).data + 0x6c));
        Logger::error(pLVar13,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        AttachmentInfo::AttachmentInfo((AttachmentInfo *)local_90,local_50,(aiNode *)scene_local);
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::push_back
                  (attach,(value_type *)local_90);
        sVar11 = std::
                 vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                 ::size((vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                         *)((rootOut_local->mName).data + 0x94));
        if (sVar11 == local_50->mNumMaterials) {
          for (src._4_4_ = 0; src._4_4_ < local_50->mNumMaterials; src._4_4_ = src._4_4_ + 1) {
            paVar3 = local_50->mMaterials[src._4_4_];
            if (paVar3 != (aiMaterial *)0x0) {
              aiMaterial::~aiMaterial(paVar3);
              operator_delete(paVar3,0x10);
            }
            pvStack_a0 = std::
                         vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                         ::operator[]((vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                                       *)((rootOut_local->mName).data + 0x94),(ulong)src._4_4_);
            local_50->mMaterials[src._4_4_] = pvStack_a0->first;
          }
          for (mesh._4_4_ = 0; mesh._4_4_ < local_50->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
            src_1 = (pair<aiMaterial_*,_unsigned_int> *)local_50->mMeshes[mesh._4_4_];
            mat_1 = (aiMaterial *)
                    std::
                    vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                                  *)((rootOut_local->mName).data + 0x94),
                                 (ulong)((aiMesh *)src_1)->mMaterialIndex);
            _a = (aiMaterial *)mat_1->mProperties;
            bVar9 = aiMesh::HasVertexColors((aiMesh *)src_1,0);
            if ((bVar9) && ((mat_1->mNumProperties & 1) != 0)) {
              a_1._3_1_ = '\x01';
              for (idx = 1; (uint)idx < *(uint *)((long)&src_1->first + 4); idx = idx + 1) {
                fVar2 = (float)src_1[3].first[(uint)idx].mNumAllocated;
                puVar1 = &src_1[3].first[idx - 1].mNumAllocated;
                if ((fVar2 != (float)*puVar1) || (NAN(fVar2) || NAN((float)*puVar1))) {
                  a_1._3_1_ = '\0';
                  break;
                }
              }
              if (a_1._3_1_ != '\0') {
                pLVar13 = DefaultLogger::get();
                Logger::info(pLVar13,"IRR: Replacing mesh vertex alpha with common opacity");
                for (mul = 0; mul < *(uint *)((long)&src_1->first + 4); mul = mul + 1) {
                  src_1[3].first[mul].mNumAllocated = 0x3f800000;
                }
                aiMaterial::AddProperty
                          (_a,(float *)&(src_1[3].first)->mNumAllocated,1,"$mat.opacity",0,0);
              }
            }
            bVar9 = aiMesh::HasTextureCoords((aiMesh *)src_1,1);
            if (bVar9) {
              local_d0 = 1;
              if ((mat_1->mNumProperties & 0x10002) == 0) {
                if ((mat_1->mNumProperties & 0x100) != 0) {
                  aiMaterial::AddProperty(_a,&local_d0,1,"$tex.uvwsrc",6,0);
                }
              }
              else {
                aiMaterial::AddProperty(_a,&local_d0,1,"$tex.uvwsrc",1,0);
              }
            }
          }
        }
        else {
          pLVar13 = DefaultLogger::get();
          Logger::warn(pLVar13,
                       "IRR: Failed to match imported materials with the materials found in the IRR scene file"
                      );
        }
      }
    }
    break;
  case 3:
    sVar11 = std::
             vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
             ::size((vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                     *)((rootOut_local->mName).data + 0x94));
    if (sVar11 < 6) {
      pLVar13 = DefaultLogger::get();
      Logger::error(pLVar13,"IRR: There should be six materials for a skybox");
    }
    else {
      sVar11 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(materials,sVar11 + 6);
      for (local_108 = 0; pvVar8 = pvStack_40, local_108 < 6; local_108 = local_108 + 1) {
        local_118._M_current =
             (aiMaterial **)std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(materials)
        ;
        __gnu_cxx::
        __normal_iterator<aiMaterial*const*,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>::
        __normal_iterator<aiMaterial**>
                  ((__normal_iterator<aiMaterial*const*,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>
                    *)&local_110,&local_118);
        __x = std::
              vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
              ::operator[]((vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            *)((rootOut_local->mName).data + 0x94),(ulong)local_108);
        local_120 = (aiMaterial **)
                    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::insert
                              (materials,local_110,&__x->first);
      }
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector(&local_138,materials);
      BuildSkybox(this,pvVar8,&local_138);
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector(&local_138);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     "IRR.SkyBox_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((rootOut_local->mName).data + 0x24));
      std::__cxx11::string::operator=
                ((string *)((rootOut_local->mName).data + 0x24),(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      pLVar13 = DefaultLogger::get();
      Logger::info(pLVar13,
                   "IRR: Loading skybox, this will require special handling to be displayed correctly"
                  );
    }
    break;
  default:
    break;
  case 6:
    pLVar13 = DefaultLogger::get();
    Logger::error(pLVar13,"IRR: Unsupported node - TERRAIN");
    break;
  case 7:
    uVar10 = *(int *)((rootOut_local->mName).data + 0xb0) *
             *(int *)((rootOut_local->mName).data + 0xb4);
    if (uVar10 < 100) {
      local_d4 = 2;
    }
    else if (uVar10 < 300) {
      local_d4 = 3;
    }
    else {
      local_d4 = 4;
    }
    local_e0 = StandardShapes::MakeMesh(local_d4,StandardShapes::MakeSphere);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(pvVar8,&local_e0);
    aiVector3t<float>::operator*=
              ((aiVector3t<float> *)((rootOut_local->mName).data + 0x18),
               *(float *)((rootOut_local->mName).data + 0xac) / 2.0);
    paVar5 = &rootOut_local->mName;
    ppaVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back(pvStack_40);
    CopyMaterial(this,materials,
                 (vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  *)(paVar5->data + 0x94),defMatIdx,*ppaVar14);
    ppaVar15 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::back(materials);
    paVar3 = *ppaVar15;
    aiVector3t<float>::aiVector3t(&local_ec,0.0,0.0,-1.0);
    SetupMapping(paVar3,aiTextureMapping_SPHERE,&local_ec);
  }
  iVar7 = localScene._4_4_;
  sVar11 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pvStack_40);
  if (iVar7 != (int)sVar11) {
    sVar11 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pvStack_40);
    scene_local[8].mNumCameras = (int)sVar11 - localScene._4_4_;
    auVar4 = ZEXT416(scene_local[8].mNumCameras) * ZEXT816(4);
    uVar16 = auVar4._0_8_;
    if (auVar4._8_8_ != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    ppaVar17 = (aiCamera **)operator_new__(uVar16);
    scene_local[8].mCameras = ppaVar17;
    for (local_15c = 0; local_15c < scene_local[8].mNumCameras; local_15c = local_15c + 1) {
      *(uint *)((long)scene_local[8].mCameras + (ulong)local_15c * 4) = localScene._4_4_ + local_15c
      ;
    }
  }
  aiString::Set((aiString *)scene_local,(string *)((rootOut_local->mName).data + 0x24));
  paVar6 = scene_local + 8;
  aVar20 = ::operator*((aiVector3t<float> *)((rootOut_local->mName).data + 0xc),0.017453292);
  mat = aVar20._0_8_;
  local_168 = mat;
  local_170 = aVar20.z;
  local_160 = local_170;
  aiMatrix4x4t<float>::FromEulerAnglesXYZ
            ((aiMatrix4x4t<float> *)&paVar6->field_0x4,(aiVector3t<float> *)&local_168);
  *(float *)&scene_local[8].field_0x4 =
       *(float *)((rootOut_local->mName).data + 0x18) * *(float *)&scene_local[8].field_0x4;
  *(float *)&scene_local[8].field_0x14 =
       *(float *)((rootOut_local->mName).data + 0x18) * *(float *)&scene_local[8].field_0x14;
  *(float *)&scene_local[8].field_0x24 =
       *(float *)((rootOut_local->mName).data + 0x18) * *(float *)&scene_local[8].field_0x24;
  *(float *)&scene_local[8].mRootNode =
       *(float *)((rootOut_local->mName).data + 0x1c) * *(float *)&scene_local[8].mRootNode;
  *(float *)&scene_local[8].mMeshes =
       *(float *)((rootOut_local->mName).data + 0x1c) * *(float *)&scene_local[8].mMeshes;
  *(float *)&scene_local[8].mMaterials =
       *(float *)((rootOut_local->mName).data + 0x1c) * *(float *)&scene_local[8].mMaterials;
  *(float *)((long)&scene_local[8].mRootNode + 4) =
       *(float *)((rootOut_local->mName).data + 0x20) *
       *(float *)((long)&scene_local[8].mRootNode + 4);
  *(float *)((long)&scene_local[8].mMeshes + 4) =
       *(float *)((rootOut_local->mName).data + 0x20) *
       *(float *)((long)&scene_local[8].mMeshes + 4);
  *(float *)((long)&scene_local[8].mMaterials + 4) =
       *(float *)((rootOut_local->mName).data + 0x20) *
       *(float *)((long)&scene_local[8].mMaterials + 4);
  scene_local[8].mNumMeshes =
       (uint)(*(float *)(rootOut_local->mName).data + (float)scene_local[8].mNumMeshes);
  scene_local[8].mNumMaterials =
       (uint)(*(float *)((rootOut_local->mName).data + 4) + (float)scene_local[8].mNumMaterials);
  scene_local[8].mNumAnimations =
       (uint)(*(float *)((rootOut_local->mName).data + 8) + (float)scene_local[8].mNumAnimations);
  ComputeAnimations(this,(Node *)rootOut_local,(aiNode *)scene_local,anims);
  sVar11 = std::vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>::
           size((vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_> *
                )((rootOut_local->mName).data + 0x44));
  scene_local[8].mNumLights = (uint)sVar11;
  if (scene_local[8].mNumLights != 0) {
    auVar4 = ZEXT416(scene_local[8].mNumLights) * ZEXT816(8);
    uVar16 = auVar4._0_8_;
    if (auVar4._8_8_ != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    ppaVar18 = (aiLight **)operator_new__(uVar16);
    scene_local[8].mLights = ppaVar18;
    for (node._4_4_ = 0; node._4_4_ < scene_local[8].mNumLights; node._4_4_ = node._4_4_ + 1) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      scene_local[8].mLights[node._4_4_] = (aiLight *)this_00;
      this_00->mParent = (aiNode *)scene_local;
      ppNVar19 = std::
                 vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>::
                 operator[]((vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                             *)((rootOut_local->mName).data + 0x44),(ulong)node._4_4_);
      GenerateGraph(this,*ppNVar19,this_00,(aiScene *)batch_local,(BatchLoader *)meshes_local,
                    pvStack_40,anims,attach,materials,defMatIdx);
    }
  }
  return;
}

Assistant:

void IRRImporter::GenerateGraph(Node* root,aiNode* rootOut ,aiScene* scene,
    BatchLoader& batch,
    std::vector<aiMesh*>&        meshes,
    std::vector<aiNodeAnim*>&    anims,
    std::vector<AttachmentInfo>& attach,
    std::vector<aiMaterial*>&    materials,
    unsigned int&                defMatIdx)
{
    unsigned int oldMeshSize = (unsigned int)meshes.size();
    //unsigned int meshTrafoAssign = 0;

    // Now determine the type of the node
    switch (root->type)
    {
    case Node::ANIMMESH:
    case Node::MESH:
        {
            if (!root->meshPath.length())
                break;

            // Get the loaded mesh from the scene and add it to
            // the list of all scenes to be attached to the
            // graph we're currently building
            aiScene* localScene = batch.GetImport(root->id);
            if (!localScene) {
                ASSIMP_LOG_ERROR("IRR: Unable to load external file: " + root->meshPath);
                break;
            }
            attach.push_back(AttachmentInfo(localScene,rootOut));

            // Now combine the material we've loaded for this mesh
            // with the real materials we got from the file. As we
            // don't execute any pp-steps on the file, the numbers
            // should be equal. If they are not, we can impossibly
            // do this  ...
            if (root->materials.size() != (unsigned int)localScene->mNumMaterials)   {
                ASSIMP_LOG_WARN("IRR: Failed to match imported materials "
                    "with the materials found in the IRR scene file");

                break;
            }
            for (unsigned int i = 0; i < localScene->mNumMaterials;++i)  {
                // Delete the old material, we don't need it anymore
                delete localScene->mMaterials[i];

                std::pair<aiMaterial*, unsigned int>& src = root->materials[i];
                localScene->mMaterials[i] = src.first;
            }

            // NOTE: Each mesh should have exactly one material assigned,
            // but we do it in a separate loop if this behaviour changes
            // in future.
            for (unsigned int i = 0; i < localScene->mNumMeshes;++i) {
                // Process material flags
                aiMesh* mesh = localScene->mMeshes[i];


                // If "trans_vertex_alpha" mode is enabled, search all vertex colors
                // and check whether they have a common alpha value. This is quite
                // often the case so we can simply extract it to a shared oacity
                // value.
                std::pair<aiMaterial*, unsigned int>& src = root->materials[mesh->mMaterialIndex];
                aiMaterial* mat = (aiMaterial*)src.first;

                if (mesh->HasVertexColors(0) && src.second & AI_IRRMESH_MAT_trans_vertex_alpha)
                {
                    bool bdo = true;
                    for (unsigned int a = 1; a < mesh->mNumVertices;++a)    {

                        if (mesh->mColors[0][a].a != mesh->mColors[0][a-1].a)   {
                            bdo = false;
                            break;
                        }
                    }
                    if (bdo)    {
                        ASSIMP_LOG_INFO("IRR: Replacing mesh vertex alpha with common opacity");

                        for (unsigned int a = 0; a < mesh->mNumVertices;++a)
                            mesh->mColors[0][a].a = 1.f;

                        mat->AddProperty(& mesh->mColors[0][0].a, 1, AI_MATKEY_OPACITY);
                    }
                }

                // If we have a second texture coordinate set and a second texture
                // (either lightmap, normalmap, 2layered material) we need to
                // setup the correct UV index for it. The texture can either
                // be diffuse (lightmap & 2layer) or a normal map (normal & parallax)
                if (mesh->HasTextureCoords(1))  {

                    int idx = 1;
                    if (src.second & (AI_IRRMESH_MAT_solid_2layer | AI_IRRMESH_MAT_lightmap))   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(0));
                    }
                    else if (src.second & AI_IRRMESH_MAT_normalmap_solid)   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                    }
                }
            }
        }
        break;

    case Node::LIGHT:
    case Node::CAMERA:

        // We're already finished with lights and cameras
        break;


    case Node::SPHERE:
        {
            // Generate the sphere model. Our input parameter to
            // the sphere generation algorithm is the number of
            // subdivisions of each triangle - but here we have
            // the number of poylgons on a specific axis. Just
            // use some hardcoded limits to approximate this ...
            unsigned int mul = root->spherePolyCountX*root->spherePolyCountY;
            if      (mul < 100)mul = 2;
            else if (mul < 300)mul = 3;
            else               mul = 4;

            meshes.push_back(StandardShapes::MakeMesh(mul,
                &StandardShapes::MakeSphere));

            // Adjust scaling
            root->scaling *= root->sphereRadius/2;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup spherical UV mapping around the Y axis.
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_SPHERE);
        }
        break;

    case Node::CUBE:
        {
            // Generate an unit cube first
            meshes.push_back(StandardShapes::MakeMesh(
                &StandardShapes::MakeHexahedron));

            // Adjust scaling
            root->scaling *= root->sphereRadius;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup cubic UV mapping
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_BOX );
        }
        break;


    case Node::SKYBOX:
        {
            // A skybox is defined by six materials
            if (root->materials.size() < 6) {
                ASSIMP_LOG_ERROR("IRR: There should be six materials for a skybox");
                break;
            }

            // copy those materials and generate 6 meshes for our new skybox
            materials.reserve(materials.size() + 6);
            for (unsigned int i = 0; i < 6;++i)
                materials.insert(materials.end(),root->materials[i].first);

            BuildSkybox(meshes,materials);

            // *************************************************************
            // Skyboxes will require a different code path for rendering,
            // so there must be a way for the user to add special support
            // for IRR skyboxes. We add a 'IRR.SkyBox_' prefix to the node.
            // *************************************************************
            root->name = "IRR.SkyBox_" + root->name;
            ASSIMP_LOG_INFO("IRR: Loading skybox, this will "
                "require special handling to be displayed correctly");
        }
        break;

    case Node::TERRAIN:
        {
            // to support terrains, we'd need to have a texture decoder
            ASSIMP_LOG_ERROR("IRR: Unsupported node - TERRAIN");
        }
        break;
    default:
        // DUMMY
        break;
    };

    // Check whether we added a mesh (or more than one ...). In this case
    // we'll also need to attach it to the node
    if (oldMeshSize != (unsigned int) meshes.size())    {

        rootOut->mNumMeshes = (unsigned int)meshes.size() - oldMeshSize;
        rootOut->mMeshes    = new unsigned int[rootOut->mNumMeshes];

        for (unsigned int a = 0; a  < rootOut->mNumMeshes;++a)  {
            rootOut->mMeshes[a] = oldMeshSize+a;
        }
    }

    // Setup the name of this node
    rootOut->mName.Set(root->name);

    // Now compute the final local transformation matrix of the
    // node from the given translation, rotation and scaling values.
    // (the rotation is given in Euler angles, XYZ order)
    //std::swap((float&)root->rotation.z,(float&)root->rotation.y);
    rootOut->mTransformation.FromEulerAnglesXYZ(AI_DEG_TO_RAD(root->rotation) );

    // apply scaling
    aiMatrix4x4& mat = rootOut->mTransformation;
    mat.a1 *= root->scaling.x;
    mat.b1 *= root->scaling.x;
    mat.c1 *= root->scaling.x;
    mat.a2 *= root->scaling.y;
    mat.b2 *= root->scaling.y;
    mat.c2 *= root->scaling.y;
    mat.a3 *= root->scaling.z;
    mat.b3 *= root->scaling.z;
    mat.c3 *= root->scaling.z;

    // apply translation
    mat.a4 += root->position.x;
    mat.b4 += root->position.y;
    mat.c4 += root->position.z;

    // now compute animations for the node
    ComputeAnimations(root,rootOut, anims);

    // Add all children recursively. First allocate enough storage
    // for them, then call us again
    rootOut->mNumChildren = (unsigned int)root->children.size();
    if (rootOut->mNumChildren)  {

        rootOut->mChildren = new aiNode*[rootOut->mNumChildren];
        for (unsigned int i = 0; i < rootOut->mNumChildren;++i) {

            aiNode* node = rootOut->mChildren[i] =  new aiNode();
            node->mParent = rootOut;
            GenerateGraph(root->children[i],node,scene,batch,meshes,
                anims,attach,materials,defMatIdx);
        }
    }
}